

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::NodeIterator::
NodeIterator(NodeIterator *this,self_type *index)

{
  size_t sVar1;
  _Map_pointer in_RSI;
  stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
  *in_RDI;
  int i;
  model_node_type *node;
  iterator *__x;
  int local_28;
  
  (in_RDI->c).
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_map = in_RSI;
  (in_RDI->c).
  super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>._M_impl
  .super__Deque_impl_data._M_map_size = (size_t)*in_RSI;
  __x = &(in_RDI->c).
         super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
         _M_impl.super__Deque_impl_data._M_start;
  std::
  stack<alex::AlexNode<int,int>*,std::deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>>
  ::stack<std::deque<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>,void>
            (in_RDI);
  if (((in_RDI->c).
       super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
       _M_impl.super__Deque_impl_data._M_map_size != 0) &&
     ((*(byte *)((in_RDI->c).
                 super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                 ._M_impl.super__Deque_impl_data._M_map_size + 8) & 1) == 0)) {
    sVar1 = (in_RDI->c).
            super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
            ._M_impl.super__Deque_impl_data._M_map_size;
    std::
    stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
    ::push(in_RDI,(value_type *)__x);
    for (local_28 = *(int *)(sVar1 + 0x30) + -2; -1 < local_28; local_28 = local_28 + -1) {
      if (*(long *)(*(long *)(sVar1 + 0x38) + (long)local_28 * 8) !=
          *(long *)(*(long *)(sVar1 + 0x38) + (long)(local_28 + 1) * 8)) {
        std::
        stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
        ::push(in_RDI,(value_type *)__x);
      }
    }
  }
  return;
}

Assistant:

explicit NodeIterator(const self_type* index)
        : index_(index), cur_node_(index->root_node_) {
      if (cur_node_ && !cur_node_->is_leaf_) {
        auto node = static_cast<model_node_type*>(cur_node_);
        node_stack_.push(node->children_[node->num_children_ - 1]);
        for (int i = node->num_children_ - 2; i >= 0; i--) {
          if (node->children_[i] != node->children_[i + 1]) {
            node_stack_.push(node->children_[i]);
          }
        }
      }
    }